

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void BasePort::AddHardwareVersionString(string *hStr)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  allocator<char> local_49;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  string local_38 [32];
  unsigned_long local_18;
  unsigned_long hver;
  string *hStr_local;
  
  hver = (unsigned_long)hStr;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_18 = 0;
    iVar1 = std::__cxx11::string::compare(hver,0,(char *)0x2);
    if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare(hver,0,(char *)0x2), iVar1 == 0)) {
      lVar3 = std::__cxx11::string::c_str();
      local_18 = strtoul((char *)(lVar3 + 2),(char **)0x0,0x10);
    }
    else {
      std::__cxx11::string::rbegin();
      std::__cxx11::string::rend();
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,void>
                (local_38,&local_40,&local_48,&local_49);
      std::__cxx11::string::copy((char *)local_38,(ulong)&local_18,8);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_49);
    }
    AddHardwareVersion(local_18);
  }
  return;
}

Assistant:

void BasePort::AddHardwareVersionString(const std::string &hStr)
{
    if (hStr.empty()) return;
    unsigned long hver = 0;
    if ((hStr.compare(0,2,"0x") == 0) || (hStr.compare(0,2,"0X") == 0)) {
        // if hex
        hver = std::strtoul(hStr.c_str()+2, 0, 16);
    }
    else {
        std::string(hStr.rbegin(), hStr.rend()).copy(reinterpret_cast<char *>(&hver), sizeof(unsigned long));
    }
    AddHardwareVersion(hver);
}